

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_c_glib_generator.cc
# Opt level: O3

string * __thiscall
t_c_glib_generator::property_type_name_abi_cxx11_
          (string *__return_storage_ptr__,t_c_glib_generator *this,t_type *ttype,bool in_typedef,
          bool is_const)

{
  int iVar1;
  char *pcVar2;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[5])(ttype);
  if ((char)iVar1 == '\0') {
    type_name_abi_cxx11_(&local_50,this,ttype,in_typedef,is_const);
  }
  else {
    if (*(int *)&ttype[1].super_t_doc._vptr_t_doc - 3U < 3) {
      pcVar2 = "gint";
      if (is_const) {
        pcVar2 = "const gint";
      }
      std::__cxx11::string::_M_replace
                ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
                 (ulong)pcVar2);
      return __return_storage_ptr__;
    }
    type_name_abi_cxx11_(&local_50,this,ttype,in_typedef,is_const);
  }
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_c_glib_generator::property_type_name(t_type* ttype, bool in_typedef, bool is_const) {
  string result;

  if (ttype->is_base_type()) {
    switch (((t_base_type*)ttype)->get_base()) {
    case t_base_type::TYPE_I8:
    case t_base_type::TYPE_I16:
    case t_base_type::TYPE_I32:
      if (is_const) {
        result = "const gint";
      } else {
        result = "gint";
      }
      break;

    default:
      result = type_name(ttype, in_typedef, is_const);
    }
  } else {
    result = type_name(ttype, in_typedef, is_const);
  }

  return result;
}